

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,
          ArgMinMaxState<duckdb::string_t,_double> *state,string_t x_data,double y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  string_t new_value;
  double local_28;
  
  lVar2 = x_data.value._8_8_;
  new_value.value._0_8_ = x_data.value._0_8_;
  lVar3 = lVar2;
  local_28 = y_data;
  bVar1 = GreaterThan::Operation<double>((double *)(this + 0x18),&local_28);
  if (bVar1) {
    TemplatedValidityMask<unsigned_long>::RowIsValid
              (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 8),*(idx_t *)(lVar2 + 0x18));
    new_value.value.pointer.ptr = (char *)lVar3;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)(this + 8),(string_t *)state,new_value);
    *(double *)(this + 0x18) = local_28;
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}